

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++_test.cc
# Opt level: O3

void __thiscall
osqp::anon_unknown_0::OsqpTest_TwoDimLPWithEquality_Test::TestBody
          (OsqpTest_TwoDimLPWithEquality_Test *this)

{
  OsqpExitCode OVar1;
  double *pdVar2;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar3;
  undefined8 *puVar4;
  char *pcVar5;
  pointer *__ptr;
  variable_if_dynamic<long,__1> __ptr_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *message;
  char *in_R9;
  pointer *__ptr_2;
  Span<const_double> expected;
  Span<const_double> expected_00;
  OsqpSolver solver;
  OsqpInstance instance;
  SparseMatrix<double,_0,_int> constraint_matrix;
  Triplet<double,_int> kTripletsA [4];
  OsqpExitCode in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd8c;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var6;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var7;
  undefined4 uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_268;
  __uniq_ptr_impl<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter> local_260;
  _Head_base<0UL,_osqp::OSQPWorkspaceHelper_*,_false> this_01;
  variable_if_dynamic<long,__1> vStack_250;
  undefined8 in_stack_fffffffffffffdb8;
  undefined8 in_stack_fffffffffffffdc0;
  AssertHelper in_stack_fffffffffffffdc8;
  undefined1 local_230 [24];
  double *local_218;
  StorageIndex *pSStack_210;
  CompressedStorage<double,_int> local_208;
  StorageIndex *pSStack_1e8;
  undefined1 local_190 [24];
  StorageIndex *pSStack_178;
  StorageIndex *local_170;
  CompressedStorage<double,_long_long> CStack_168;
  Matrix<double,__1,_1,_0,__1,_1> local_148;
  SparseMatrix<double,_0,_long_long> local_138;
  Matrix<double,__1,_1,_0,__1,_1> local_f0;
  Matrix<double,__1,_1,_0,__1,_1> local_e0;
  Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_d0;
  Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_b8;
  SparseMatrix<double,_0,_int> local_a0;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  
  local_a0.super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>.
  super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>.m_isRValue =
       (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>)false;
  local_a0.m_outerSize = 0;
  local_a0.m_innerSize = 0;
  local_a0.m_outerIndex = (StorageIndex *)0x0;
  local_a0.m_innerNonZeros = (StorageIndex *)0x0;
  local_a0.m_data.m_values = (Scalar *)0x0;
  local_a0.m_data.m_indices = (StorageIndex_conflict *)0x0;
  local_a0.m_data.m_size = 0;
  local_a0.m_data.m_allocatedSize = 0;
  Eigen::SparseMatrix<double,_0,_int>::resize(&local_a0,3,2);
  local_190._0_8_ = &local_58;
  local_58 = 0;
  local_50 = 0x3ff0000000000000;
  local_48 = 0x100000000;
  local_40 = 0x3ff0000000000000;
  local_38 = 1;
  local_30 = 0x3ff0000000000000;
  local_28 = 0x100000002;
  local_20 = 0x3ff0000000000000;
  local_230._0_8_ = &stack0xffffffffffffffe8;
  Eigen::internal::
  set_from_triplets<Eigen::Triplet<double,int>const*,Eigen::SparseMatrix<double,0,int>,Eigen::internal::scalar_sum_op<double,double>>
            (local_190,local_230,&local_a0,&stack0xfffffffffffffda8);
  local_190._0_8_ = local_190._0_8_ & 0xffffffffffffff00;
  local_190._8_8_ = -NAN;
  local_190._16_8_ = 0;
  pSStack_178 = (StorageIndex *)0x0;
  local_170 = (StorageIndex *)0x0;
  CStack_168.m_values = (Scalar *)0x0;
  CStack_168.m_indices = (StorageIndex *)0x0;
  CStack_168.m_size = 0;
  CStack_168.m_allocatedSize = 0;
  Eigen::SparseMatrix<double,_0,_long_long>::resize
            ((SparseMatrix<double,_0,_long_long> *)local_190,0,0);
  local_148.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_148.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  local_138.super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_long_long>_>.
  super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_long_long>_>.m_isRValue =
       (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_long_long>_>)false;
  local_138.m_outerSize = -1;
  local_138.m_innerSize = 0;
  local_138.m_outerIndex = (StorageIndex *)0x0;
  local_138.m_innerNonZeros = (StorageIndex *)0x0;
  local_138.m_data.m_values = (Scalar *)0x0;
  local_138.m_data.m_indices = (StorageIndex *)0x0;
  local_138.m_data.m_size = 0;
  local_138.m_data.m_allocatedSize = 0;
  Eigen::SparseMatrix<double,_0,_long_long>::resize(&local_138,0,0);
  local_e0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_e0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  local_f0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_f0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  local_230._0_8_ = local_230._0_8_ & 0xffffffffffffff00;
  local_230._8_8_ = 0.0;
  local_230._16_8_ = 0;
  local_218 = (double *)0x0;
  pSStack_210 = (StorageIndex *)0x0;
  local_208.m_values = (Scalar *)0x0;
  local_208.m_indices = (StorageIndex_conflict *)0x0;
  local_208.m_size = 0;
  local_208.m_allocatedSize = 0;
  Eigen::SparseMatrix<double,_0,_int>::resize((SparseMatrix<double,_0,_int> *)local_230,2,2);
  Eigen::SparseMatrix<double,0,long_long>::operator=
            ((SparseMatrix<double,0,long_long> *)local_190,
             (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *)local_230);
  free(local_218);
  free(pSStack_210);
  Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&local_208);
  pdVar2 = local_148.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
  ;
  if ((double)local_148.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows != 9.88131291682493e-324) {
    free(local_148.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    pdVar2 = (double *)malloc(0x10);
    if (((ulong)pdVar2 & 0xf) != 0) goto LAB_0011d05a;
    if (pdVar2 == (double *)0x0) goto LAB_0011d079;
  }
  local_148.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = pdVar2
  ;
  local_230._0_8_ = &local_148;
  local_148.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 2;
  local_230._8_8_ = 0.0;
  local_230._16_8_ = 1;
  local_218 = (double *)0x1;
  *local_148.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = -1.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
            ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_230,
             (Scalar *)&stack0xfffffffffffffda8);
  if (((long)local_218 + local_230._8_8_ !=
       (((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_230._0_8_)->m_storage).
       m_rows) || (local_230._16_8_ != 1)) {
LAB_0011d03b:
    __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                  ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                  "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::finished() [MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  Eigen::SparseMatrix<double,0,long_long>::operator=
            ((SparseMatrix<double,0,long_long> *)&local_138,
             (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *)&local_a0);
  pdVar2 = local_f0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  if (local_f0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != 3)
  {
    free(local_f0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    pdVar2 = (double *)malloc(0x18);
    if (((ulong)pdVar2 & 0xf) != 0) goto LAB_0011d05a;
    if (pdVar2 == (double *)0x0) goto LAB_0011d079;
  }
  local_f0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = pdVar2;
  local_230._0_8_ = &local_f0;
  local_f0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 3;
  local_230._8_8_ = 0.0;
  local_230._16_8_ = 1;
  local_218 = (double *)0x1;
  *local_f0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       -INFINITY;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_230,
                      (Scalar *)&stack0xfffffffffffffda8);
  _Var6._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3fe0000000000000
  ;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
            (pCVar3,(Scalar *)&stack0xfffffffffffffd90);
  if (((long)local_218 + local_230._8_8_ !=
       (((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_230._0_8_)->m_storage).
       m_rows) || (local_230._16_8_ != 1)) goto LAB_0011d03b;
  pdVar2 = local_e0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  if (local_e0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != 3)
  {
    free(local_e0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    pdVar2 = (double *)malloc(0x18);
    if (((ulong)pdVar2 & 0xf) != 0) {
LAB_0011d05a:
      __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                    "void *Eigen::internal::aligned_malloc(std::size_t)");
    }
    if (pdVar2 == (double *)0x0) {
LAB_0011d079:
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar4 = execv;
      __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  local_e0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = pdVar2;
  local_230._0_8_ = &local_e0;
  local_e0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 3;
  local_230._8_8_ = 0.0;
  local_230._16_8_ = 1;
  local_218 = (double *)0x1;
  *local_e0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = 1.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_230,
                      (Scalar *)&(anonymous_namespace)::kInfinity);
  this_01._M_head_impl = (OSQPWorkspaceHelper *)0x3fe0000000000000;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
            (pCVar3,(Scalar *)&stack0xfffffffffffffda8);
  if (((long)local_218 + local_230._8_8_ !=
       (((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_230._0_8_)->m_storage).
       m_rows) || (local_230._16_8_ != 1)) goto LAB_0011d03b;
  local_260._M_t.super__Tuple_impl<0UL,_osqp::OSQPWorkspaceHelper_*,_osqp::OsqpSolver::OsqpDeleter>.
  super__Head_base<0UL,_osqp::OSQPWorkspaceHelper_*,_false>._M_head_impl =
       (tuple<osqp::OSQPWorkspaceHelper_*,_osqp::OsqpSolver::OsqpDeleter>)
       (_Tuple_impl<0UL,_osqp::OSQPWorkspaceHelper_*,_osqp::OsqpSolver::OsqpDeleter>)0x0;
  OsqpSettings::OsqpSettings((OsqpSettings *)local_230);
  local_208.m_allocatedSize = (Index)&DAT_3ee4f8b588e368f1;
  pSStack_1e8 = (StorageIndex *)0x0;
  OsqpSolver::Init((OsqpSolver *)&stack0xfffffffffffffda8,(OsqpInstance *)&local_260,
                   (OsqpSettings *)local_190);
  this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_268;
  _Var7._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._1_7_ = (undefined7)((ulong)_Var6._M_head_impl >> 8);
  _Var7._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ =
       (_Tuple_impl<0UL,_osqp::OSQPWorkspaceHelper_*,_osqp::OsqpSolver::OsqpDeleter>)
       this_01._M_head_impl == (OSQPWorkspaceHelper *)0x1;
  local_268 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (((ulong)this_01._M_head_impl & 1) == 0) {
    absl::status_internal::StatusRep::Unref((StatusRep *)this_01._M_head_impl);
    if (((ulong)_Var7._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl & 1) != 0) goto LAB_0011cda0;
LAB_0011ccf3:
    testing::Message::Message((Message *)&stack0xfffffffffffffd88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&stack0xfffffffffffffda8,(internal *)&stack0xfffffffffffffd90,
               (AssertionResult *)"solver.Init(instance, settings).ok()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffdc8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
               ,0xbf,(char *)this_01._M_head_impl);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffdc8,(Message *)&stack0xfffffffffffffd88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffdc8);
    if (this_01._M_head_impl != (OSQPWorkspaceHelper *)&stack0xfffffffffffffdb8) {
      operator_delete(this_01._M_head_impl,in_stack_fffffffffffffdb8 + 1);
    }
    if ((long *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88) + 8))();
    }
    __ptr_00.m_value = (long)local_268;
    if (local_268 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0011cfa6;
  }
  else {
    if ((_Tuple_impl<0UL,_osqp::OSQPWorkspaceHelper_*,_osqp::OsqpSolver::OsqpDeleter>)
        this_01._M_head_impl != (OSQPWorkspaceHelper *)0x1) goto LAB_0011ccf3;
LAB_0011cda0:
    uVar8 = _Var7._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_;
    if (local_268 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(this_00,local_268);
    }
    OVar1 = OsqpSolver::Solve((OsqpSolver *)&local_260);
    _Var6._M_head_impl._4_4_ = uVar8;
    _Var6._M_head_impl._0_4_ = OVar1;
    OVar1 = kOptimal;
    testing::internal::CmpHelperEQ<osqp::OsqpExitCode,osqp::OsqpExitCode>
              ((internal *)&stack0xfffffffffffffda8,"solver.Solve()","OsqpExitCode::kOptimal",
               (OsqpExitCode *)&stack0xfffffffffffffd90,(OsqpExitCode *)&stack0xfffffffffffffd88);
    if (SUB81(this_01._M_head_impl,0) != (internal)0x0) {
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)vStack_250.m_value !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vStack_250,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     vStack_250.m_value);
      }
      OsqpSolver::objective_value((OsqpSolver *)&local_260);
      pcVar5 = "kTolerance";
      testing::internal::DoubleNearPredFormat
                ((char *)_Var6._M_head_impl,(char *)CONCAT44(in_stack_fffffffffffffd8c,OVar1),
                 (char *)this_01._M_head_impl,(double)in_stack_fffffffffffffdc8.data_,
                 (double)in_stack_fffffffffffffdc0,(double)in_stack_fffffffffffffdb8);
      if (SUB81(this_01._M_head_impl,0) == (internal)0x0) {
        testing::Message::Message((Message *)&stack0xfffffffffffffd90);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)vStack_250.m_value
            == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = "";
        }
        else {
          message = *(char **)vStack_250.m_value;
        }
        pcVar5 = (char *)0xc2;
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffffd88,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
                   ,0xc2,message);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffffd88,(Message *)&stack0xfffffffffffffd90);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffd88);
        if ((__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )_Var6._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          (**(code **)(*(long *)_Var6._M_head_impl + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)vStack_250.m_value !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vStack_250,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     vStack_250.m_value);
      }
      OsqpSolver::primal_solution(&local_b8,(OsqpSolver *)&local_260);
      vStack_250.m_value = 0x3fe0000000000000;
      expected.len_ = (size_type)pcVar5;
      expected.ptr_ = (pointer)0x2;
      ExpectElementsAre((anon_unknown_0 *)&local_b8,
                        (Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>
                         *)&stack0xfffffffffffffda8,expected,1e-05);
      OsqpSolver::dual_solution(&local_d0,(OsqpSolver *)&local_260);
      expected_00.len_ = (size_type)pcVar5;
      expected_00.ptr_ = (pointer)0x3;
      ExpectElementsAre((anon_unknown_0 *)&local_d0,
                        (Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>
                         *)&DAT_001b7f70,expected_00,1e-05);
      goto LAB_0011cfa6;
    }
    testing::Message::Message((Message *)&stack0xfffffffffffffd90);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)vStack_250.m_value ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)vStack_250.m_value;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffd88,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
               ,0xc0,pcVar5);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffd88,(Message *)&stack0xfffffffffffffd90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffd88);
    if (_Var6._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var6._M_head_impl + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)vStack_250.m_value ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) goto LAB_0011cfa6;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&vStack_250;
    __ptr_00.m_value = vStack_250.m_value;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __ptr_00.m_value);
LAB_0011cfa6:
  std::unique_ptr<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter>::~unique_ptr
            ((unique_ptr<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter> *)&local_260);
  free(local_e0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(local_f0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(local_138.m_outerIndex);
  free(local_138.m_innerNonZeros);
  Eigen::internal::CompressedStorage<double,_long_long>::~CompressedStorage(&local_138.m_data);
  free(local_148.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(pSStack_178);
  free(local_170);
  Eigen::internal::CompressedStorage<double,_long_long>::~CompressedStorage(&CStack_168);
  free(local_a0.m_outerIndex);
  free(local_a0.m_innerNonZeros);
  Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&local_a0.m_data);
  return;
}

Assistant:

TEST(OsqpTest, TwoDimLPWithEquality) {
  // Minimize -x subject to:
  // x + y <= 1, x >= 0, y == 0.5.

  SparseMatrix<double> constraint_matrix(3, 2);
  const Triplet<double> kTripletsA[] = {
      {0, 0, 1.0}, {0, 1, 1.0}, {1, 0, 1.0}, {2, 1, 1.0}};
  constraint_matrix.setFromTriplets(std::begin(kTripletsA),
                                    std::end(kTripletsA));

  OsqpInstance instance;
  instance.objective_matrix = SparseMatrix<double>(2, 2);
  instance.objective_vector.resize(2);
  instance.objective_vector << -1.0, 0.0;
  instance.constraint_matrix = constraint_matrix;
  instance.lower_bounds.resize(3);
  instance.lower_bounds << -kInfinity, 0.0, 0.5;
  instance.upper_bounds.resize(3);
  instance.upper_bounds << 1.0, kInfinity, 0.5;

  OsqpSolver solver;
  OsqpSettings settings;
  settings.eps_abs = kTolerance;
  settings.eps_rel = 0.0;
  ASSERT_TRUE(solver.Init(instance, settings).ok());
  ASSERT_EQ(solver.Solve(), OsqpExitCode::kOptimal);

  EXPECT_NEAR(solver.objective_value(), -0.5, kTolerance);
  ExpectElementsAre(solver.primal_solution(), {0.5, 0.5}, kTolerance);
  ExpectElementsAre(solver.dual_solution(), {1.0, 0.0, -1.0}, kTolerance);
}